

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O0

unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> __thiscall
verilogAST::SliceBlacklister::visit
          (SliceBlacklister *this,
          unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *node)

{
  unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *in_RDX;
  unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> local_38;
  unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> local_30;
  byte local_21;
  bool prev;
  unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *node_local;
  SliceBlacklister *this_local;
  
  local_21 = *(byte *)&node[3]._M_t.
                       super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>
                       .super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl & 1;
  *(undefined1 *)
   &node[3]._M_t.super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>.
    _M_t.super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
    super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl = 1;
  node_local = node;
  this_local = this;
  std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::unique_ptr
            (&local_38,in_RDX);
  Transformer::visit((Transformer *)&local_30,node);
  std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::operator=
            (in_RDX,&local_30);
  std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::~unique_ptr
            (&local_30);
  std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::~unique_ptr
            (&local_38);
  *(byte *)&node[3]._M_t.
            super___uniq_ptr_impl<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>._M_t.
            super__Tuple_impl<0UL,_verilogAST::Slice_*,_std::default_delete<verilogAST::Slice>_>.
            super__Head_base<0UL,_verilogAST::Slice_*,_false>._M_head_impl = local_21 & 1;
  std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>::unique_ptr
            ((unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_> *)this,in_RDX);
  return (__uniq_ptr_data<verilogAST::Slice,_std::default_delete<verilogAST::Slice>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Slice,_std::default_delete<verilogAST::Slice>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Slice> SliceBlacklister::visit(std::unique_ptr<Slice> node) {
  bool prev = this->blacklist;
  this->blacklist = true;
  node = Transformer::visit(std::move(node));
  // Restore prev value, since we could be nested inside an slice
  this->blacklist = prev;
  return node;
}